

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:971:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:971:17)>
             *this)

{
  Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> lock;
  PredicateImpl impl;
  PromiseCrossThreadFulfillerPair<void> paf;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_1f9;
  undefined1 local_1f8 [24];
  Disposer *pDStack_1e0;
  Waiter *local_1d8;
  PromiseCrossThreadFulfillerPair<void> local_1c8;
  WaitScope local_1b0;
  undefined1 local_190;
  EventLoop local_180;
  UnixEventPort local_108;
  
  UnixEventPort::UnixEventPort(&local_108);
  EventLoop::EventLoop(&local_180,&local_108.super_EventPort);
  local_1b0.busyPollInterval = 0xffffffff;
  local_1b0.fiber.ptr = (FiberBase *)0x0;
  local_1b0.runningStacksPool.ptr = (FiberPool *)0x0;
  local_1b0.loop = &local_180;
  EventLoop::enterScope(&local_180);
  newPromiseAndCrossThreadFulfiller<void>();
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *)
             local_1f8,(this->f).fulfillerMutex);
  local_1f8._16_8_ = local_1c8.fulfiller.disposer;
  pDStack_1e0 = (Disposer *)local_1c8.fulfiller.ptr;
  local_1c8.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_1f8._8_8_,
             (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(local_1f8 + 0x10));
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(local_1f8 + 0x10));
  local_1f8._16_8_ = &PTR_check_00583560;
  local_1d8 = (Waiter *)local_1f8._8_8_;
  local_190 = 0;
  pDStack_1e0 = (Disposer *)&local_1f9;
  kj::_::Mutex::wait((Mutex *)local_1f8._0_8_,local_1f8 + 0x10);
  Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_>::~Locked
            ((Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *)local_1f8);
  local_1f8._16_8_ = (Maybe<kj::_::Mutex::Waiter_&> *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c8,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_1f8 + 0x10));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_1f8 + 0x10));
  MutexGuarded<bool>::lockExclusive((MutexGuarded<bool> *)local_1f8,(this->f).done);
  local_1f8._16_8_ = &PTR_check_00583590;
  local_1d8 = (Waiter *)local_1f8._8_8_;
  local_190 = 0;
  pDStack_1e0 = (Disposer *)&local_1f9;
  kj::_::Mutex::wait((Mutex *)local_1f8._0_8_,local_1f8 + 0x10);
  Locked<bool>::~Locked((Locked<bool> *)local_1f8);
  PromiseCrossThreadFulfillerPair<void>::~PromiseCrossThreadFulfillerPair(&local_1c8);
  WaitScope::~WaitScope(&local_1b0);
  EventLoop::~EventLoop(&local_180);
  UnixEventPort::~UnixEventPort(&local_108);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }